

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeEncoder::SetPredictionSchemeParentAttributes
          (SequentialAttributeEncoder *this,PredictionSchemeInterface *ps)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  PointCloud *this_00;
  PointAttribute *pPVar4;
  PointCloud *in_RSI;
  long in_RDI;
  int att_id;
  int i;
  Type in_stack_ffffffffffffffbc;
  PointCloud *in_stack_ffffffffffffffc0;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar1 = (*in_RSI->_vptr_PointCloud[5])();
    if (iVar1 <= (int)local_1c) {
      return true;
    }
    this_00 = PointCloudEncoder::point_cloud(*(PointCloudEncoder **)(in_RDI + 8));
    (*in_RSI->_vptr_PointCloud[6])(in_RSI,(ulong)local_1c);
    iVar2 = PointCloud::GetNamedAttributeId(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar2 == -1) break;
    in_stack_ffffffffffffffc0 = in_RSI;
    pPVar4 = PointCloudEncoder::GetPortableAttribute
                       ((PointCloudEncoder *)this_00,(int32_t)((ulong)in_RSI >> 0x20));
    uVar3 = (*in_stack_ffffffffffffffc0->_vptr_PointCloud[7])(in_stack_ffffffffffffffc0,pPVar4);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool SequentialAttributeEncoder::SetPredictionSchemeParentAttributes(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = encoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
    if (!ps->SetParentAttribute(encoder_->GetPortableAttribute(att_id))) {
      return false;
    }
  }
  return true;
}